

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctflt.c
# Opt level: O0

void jpeg_idct_float(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  undefined1 *puVar1;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  float *wsptr;
  FLOAT_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  float z13;
  float z12;
  float z11;
  float z10;
  float z5;
  float tmp13;
  float tmp12;
  float tmp11;
  float tmp10;
  float tmp7;
  float tmp6;
  float tmp5;
  float tmp4;
  float tmp3;
  float tmp2;
  float tmp1;
  float tmp0;
  float local_198 [16];
  float local_158 [8];
  float local_138 [8];
  float local_118 [8];
  float local_f8 [8];
  float local_d8 [8];
  float local_b8 [9];
  int local_94;
  long local_90;
  float *local_80;
  float *pfStack_78;
  float dcval;
  short *local_70;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  uint local_24;
  long local_20;
  
  local_90 = *(long *)(in_RDI + 0x1a8);
  pfStack_78 = *(float **)(in_RSI + 0x58);
  local_80 = local_198;
  local_70 = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  for (local_94 = 8; 0 < local_94; local_94 = local_94 + -1) {
    if ((((local_70[8] == 0) && (local_70[0x10] == 0)) && (local_70[0x18] == 0)) &&
       (((local_70[0x20] == 0 && (local_70[0x28] == 0)) &&
        ((local_70[0x30] == 0 && (local_70[0x38] == 0)))))) {
      fVar2 = (float)(int)*local_70 * *pfStack_78 * 0.125;
      *local_80 = fVar2;
      local_80[8] = fVar2;
      local_80[0x10] = fVar2;
      local_80[0x18] = fVar2;
      local_80[0x20] = fVar2;
      local_80[0x28] = fVar2;
      local_80[0x30] = fVar2;
      local_80[0x38] = fVar2;
    }
    else {
      local_30 = (float)(int)*local_70 * *pfStack_78 * 0.125;
      fVar2 = (float)(int)local_70[0x10] * pfStack_78[0x10] * 0.125;
      fVar3 = (float)(int)local_70[0x20] * pfStack_78[0x20] * 0.125;
      fVar4 = (float)(int)local_70[0x30] * pfStack_78[0x30] * 0.125;
      local_34 = local_30 + fVar3;
      local_30 = local_30 - fVar3;
      fVar3 = fVar2 + fVar4;
      fVar2 = (fVar2 - fVar4) * 1.4142135 - fVar3;
      local_28 = local_34 + fVar3;
      local_34 = local_34 - fVar3;
      local_2c = local_30 + fVar2;
      local_30 = local_30 - fVar2;
      fVar5 = (float)(int)local_70[8] * pfStack_78[8] * 0.125;
      fVar2 = (float)(int)local_70[0x18] * pfStack_78[0x18] * 0.125;
      fVar6 = (float)(int)local_70[0x28] * pfStack_78[0x28] * 0.125;
      fVar3 = (float)(int)local_70[0x38] * pfStack_78[0x38] * 0.125;
      fVar4 = fVar6 + fVar2;
      fVar6 = fVar6 - fVar2;
      fVar2 = fVar5 + fVar3;
      fVar5 = fVar5 - fVar3;
      local_44 = fVar2 + fVar4;
      fVar3 = (fVar6 + fVar5) * 1.847759;
      local_40 = (-fVar6 * 2.613126 + fVar3) - local_44;
      local_3c = (fVar2 - fVar4) * 1.4142135 - local_40;
      local_38 = (-fVar5 * 1.0823922 + fVar3) - local_3c;
      *local_80 = local_28 + local_44;
      local_80[0x38] = local_28 - local_44;
      local_80[8] = local_2c + local_40;
      local_80[0x30] = local_2c - local_40;
      local_80[0x10] = local_30 + local_3c;
      local_80[0x28] = local_30 - local_3c;
      local_80[0x18] = local_34 + local_38;
      local_80[0x20] = local_34 - local_38;
    }
    local_70 = local_70 + 1;
    pfStack_78 = pfStack_78 + 1;
    local_80 = local_80 + 1;
  }
  local_80 = local_198;
  for (local_94 = 0; local_94 < 8; local_94 = local_94 + 1) {
    puVar1 = (undefined1 *)(*(long *)(local_20 + (long)local_94 * 8) + (ulong)local_24);
    fVar6 = *local_80 + 128.5 + local_80[4];
    fVar5 = (*local_80 + 128.5) - local_80[4];
    fVar2 = local_80[2] + local_80[6];
    fVar3 = (local_80[2] - local_80[6]) * 1.4142135 + -fVar2;
    fVar4 = fVar6 + fVar2;
    fVar6 = fVar6 - fVar2;
    fVar2 = fVar5 + fVar3;
    fVar5 = fVar5 - fVar3;
    fVar3 = local_80[1] + local_80[7] + local_80[5] + local_80[3];
    fVar7 = ((local_80[5] - local_80[3]) + (local_80[1] - local_80[7])) * 1.847759;
    fVar8 = (-(local_80[5] - local_80[3]) * 2.613126 + fVar7) - fVar3;
    fVar9 = ((local_80[1] + local_80[7]) - (local_80[5] + local_80[3])) * 1.4142135 - fVar8;
    fVar7 = (-(local_80[1] - local_80[7]) * 1.0823922 + fVar7) - fVar9;
    *puVar1 = *(undefined1 *)(local_90 + (int)((int)(fVar4 + fVar3) & 0x3ff));
    puVar1[7] = *(undefined1 *)(local_90 + (int)((int)(fVar4 - fVar3) & 0x3ff));
    puVar1[1] = *(undefined1 *)(local_90 + (int)((int)(fVar2 + fVar8) & 0x3ff));
    puVar1[6] = *(undefined1 *)(local_90 + (int)((int)(fVar2 - fVar8) & 0x3ff));
    puVar1[2] = *(undefined1 *)(local_90 + (int)((int)(fVar5 + fVar9) & 0x3ff));
    puVar1[5] = *(undefined1 *)(local_90 + (int)((int)(fVar5 - fVar9) & 0x3ff));
    puVar1[3] = *(undefined1 *)(local_90 + (int)((int)(fVar6 + fVar7) & 0x3ff));
    puVar1[4] = *(undefined1 *)(local_90 + (int)((int)(fVar6 - fVar7) & 0x3ff));
    local_80 = local_80 + 8;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_float(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  FAST_FLOAT tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  FAST_FLOAT tmp10, tmp11, tmp12, tmp13;
  FAST_FLOAT z5, z10, z11, z12, z13;
  JCOEFPTR inptr;
  FLOAT_MULT_TYPE *quantptr;
  FAST_FLOAT *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = cinfo->sample_range_limit;
  int ctr;
  FAST_FLOAT workspace[DCTSIZE2]; /* buffers data between passes */
#define _0_125  ((FLOAT_MULT_TYPE)0.125)

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (FLOAT_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */

    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 2] == 0 &&
        inptr[DCTSIZE * 3] == 0 && inptr[DCTSIZE * 4] == 0 &&
        inptr[DCTSIZE * 5] == 0 && inptr[DCTSIZE * 6] == 0 &&
        inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero */
      FAST_FLOAT dcval = DEQUANTIZE(inptr[DCTSIZE * 0],
                                    quantptr[DCTSIZE * 0] * _0_125);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;
      wsptr[DCTSIZE * 2] = dcval;
      wsptr[DCTSIZE * 3] = dcval;
      wsptr[DCTSIZE * 4] = dcval;
      wsptr[DCTSIZE * 5] = dcval;
      wsptr[DCTSIZE * 6] = dcval;
      wsptr[DCTSIZE * 7] = dcval;

      inptr++;                  /* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }

    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0] * _0_125);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2] * _0_125);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4] * _0_125);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6] * _0_125);

    tmp10 = tmp0 + tmp2;        /* phase 3 */
    tmp11 = tmp0 - tmp2;

    tmp13 = tmp1 + tmp3;        /* phases 5-3 */
    tmp12 = (tmp1 - tmp3) * ((FAST_FLOAT)1.414213562) - tmp13; /* 2*c4 */

    tmp0 = tmp10 + tmp13;       /* phase 2 */
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    tmp4 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1] * _0_125);
    tmp5 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3] * _0_125);
    tmp6 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5] * _0_125);
    tmp7 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7] * _0_125);

    z13 = tmp6 + tmp5;          /* phase 6 */
    z10 = tmp6 - tmp5;
    z11 = tmp4 + tmp7;
    z12 = tmp4 - tmp7;

    tmp7 = z11 + z13;           /* phase 5 */
    tmp11 = (z11 - z13) * ((FAST_FLOAT)1.414213562); /* 2*c4 */

    z5 = (z10 + z12) * ((FAST_FLOAT)1.847759065); /* 2*c2 */
    tmp10 = z5 - z12 * ((FAST_FLOAT)1.082392200); /* 2*(c2-c6) */
    tmp12 = z5 - z10 * ((FAST_FLOAT)2.613125930); /* 2*(c2+c6) */

    tmp6 = tmp12 - tmp7;        /* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 - tmp5;

    wsptr[DCTSIZE * 0] = tmp0 + tmp7;
    wsptr[DCTSIZE * 7] = tmp0 - tmp7;
    wsptr[DCTSIZE * 1] = tmp1 + tmp6;
    wsptr[DCTSIZE * 6] = tmp1 - tmp6;
    wsptr[DCTSIZE * 2] = tmp2 + tmp5;
    wsptr[DCTSIZE * 5] = tmp2 - tmp5;
    wsptr[DCTSIZE * 3] = tmp3 + tmp4;
    wsptr[DCTSIZE * 4] = tmp3 - tmp4;

    inptr++;                    /* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * And testing floats for zero is relatively expensive, so we don't bother.
     */

    /* Even part */

    /* Apply signed->unsigned and prepare float->int conversion */
    z5 = wsptr[0] + ((FAST_FLOAT)CENTERJSAMPLE + (FAST_FLOAT)0.5);
    tmp10 = z5 + wsptr[4];
    tmp11 = z5 - wsptr[4];

    tmp13 = wsptr[2] + wsptr[6];
    tmp12 = (wsptr[2] - wsptr[6]) * ((FAST_FLOAT)1.414213562) - tmp13;

    tmp0 = tmp10 + tmp13;
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    z13 = wsptr[5] + wsptr[3];
    z10 = wsptr[5] - wsptr[3];
    z11 = wsptr[1] + wsptr[7];
    z12 = wsptr[1] - wsptr[7];

    tmp7 = z11 + z13;
    tmp11 = (z11 - z13) * ((FAST_FLOAT)1.414213562);

    z5 = (z10 + z12) * ((FAST_FLOAT)1.847759065); /* 2*c2 */
    tmp10 = z5 - z12 * ((FAST_FLOAT)1.082392200); /* 2*(c2-c6) */
    tmp12 = z5 - z10 * ((FAST_FLOAT)2.613125930); /* 2*(c2+c6) */

    tmp6 = tmp12 - tmp7;
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 - tmp5;

    /* Final output stage: float->int conversion and range-limit */

    outptr[0] = range_limit[((int)(tmp0 + tmp7)) & RANGE_MASK];
    outptr[7] = range_limit[((int)(tmp0 - tmp7)) & RANGE_MASK];
    outptr[1] = range_limit[((int)(tmp1 + tmp6)) & RANGE_MASK];
    outptr[6] = range_limit[((int)(tmp1 - tmp6)) & RANGE_MASK];
    outptr[2] = range_limit[((int)(tmp2 + tmp5)) & RANGE_MASK];
    outptr[5] = range_limit[((int)(tmp2 - tmp5)) & RANGE_MASK];
    outptr[3] = range_limit[((int)(tmp3 + tmp4)) & RANGE_MASK];
    outptr[4] = range_limit[((int)(tmp3 - tmp4)) & RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}